

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::incoming_request(peer_connection *this,peer_request *r)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar3;
  pointer *pppVar4;
  pointer puVar5;
  byte bVar6;
  piece_index_t index;
  element_type *peVar7;
  pointer ppVar8;
  iterator __position;
  long lVar9;
  undefined1 auVar10 [16];
  ushort uVar11;
  undefined8 uVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  undefined4 extraout_var;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  _Var17;
  undefined4 extraout_var_00;
  alert_manager *paVar18;
  undefined4 extraout_var_01;
  time_point tVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 uVar20;
  _List_node_base *p_Var21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  const_iterator __end2;
  element_type *peVar26;
  element_type *this_01;
  bool bVar27;
  bool local_72;
  bool local_71;
  undefined1 local_70 [48];
  bool peer_interested;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_38;
  
  this_00 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar14 = this_00->_M_use_count;
    do {
      if (iVar14 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar16 = this_00->_M_use_count;
      bVar27 = iVar14 == iVar16;
      if (bVar27) {
        this_00->_M_use_count = iVar14 + 1;
        iVar16 = iVar14;
      }
      iVar14 = iVar16;
      UNLOCK();
    } while (!bVar27);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar27 = true;
  }
  else {
    bVar27 = this_00->_M_use_count == 0;
  }
  peVar26 = (element_type *)0x0;
  if (bVar27) {
    this_01 = (torrent *)0x0;
  }
  else {
    this_01 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar7 = (this_01->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  counters::inc_stats_counter(this->m_counters,0xf,1);
  uVar15 = (r->piece).m_val;
  if (-1 < (int)uVar15) {
    peVar26 = (element_type *)
              (ulong)((int)uVar15 <
                     (((this_01->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces);
  }
  peer_log(this,incoming_message,"REQUEST","piece: %d s: %x l: %x",(ulong)uVar15,
           (ulong)(uint)r->start,(ulong)(uint)r->length);
  if ((((this_01->field_0x5cc & 8) == 0) ||
      (iVar14 = (r->piece).m_val, (this->m_superseed_piece)._M_elems[0].m_val == iVar14)) ||
     ((this->m_superseed_piece)._M_elems[1].m_val == iVar14)) {
    local_70._24_8_ = peVar26;
    local_70._40_8_ = peVar7;
    if ((this->field_0x886 & 8) == 0) {
      incoming_have_none(this);
    }
    iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
    if ((char)iVar14 == '\0') {
      plVar3 = &this->m_extensions;
      p_Var21 = (_List_node_base *)plVar3;
      do {
        p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                     *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var21 == (_List_node_base *)plVar3) {
          iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
          if ((char)iVar14 != '\0') break;
          if ((((this_01->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length < 1) {
            counters::inc_stats_counter(this->m_counters,0x11,1);
            peer_log(this,info,"INVALID_REQUEST","we don\'t have metadata yet");
          }
          else {
            ppVar8 = (this->m_requests).
                     super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     .
                     super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_70._16_8_ = (this->super_peer_connection_hot_members).m_settings;
            local_70._32_8_ =
                 (this->m_requests).
                 super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
                 super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_70[8] = 0;
            local_70._0_8_ = (mutex *)(local_70._16_8_ + 0x438);
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_70);
            local_70._32_4_ = (int)((ulong)((long)ppVar8 - local_70._32_8_) >> 2) * -0x55555555;
            local_70[8] = 1;
            iVar14 = *(int *)(local_70._16_8_ + 0x1c4);
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
            if ((int)local_70._32_4_ <= iVar14) {
              _Var17 = ::std::
                       __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                                 ((this->m_accept_fast).
                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->m_accept_fast).
                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,r);
              uVar20 = 0xffffffff;
              if (_Var17._M_current !=
                  (this->m_accept_fast).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar20 = (undefined4)
                         ((ulong)((long)_Var17._M_current -
                                 (long)(this->m_accept_fast).
                                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
              }
              if ((this->field_0x887 & 2) == 0) {
                iVar14 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)
                           ._vptr_session_logger[5])();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar14) + 0x68) < 0) {
                  uVar22 = 0xffffffff;
                  if (local_70[0x18] != '\0') {
                    uVar15 = file_storage::piece_size
                                       (&((this_01->super_torrent_hot_members).m_torrent_file.
                                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
                    uVar22 = (ulong)uVar15;
                  }
                  peVar26 = (this_01->super_torrent_hot_members).m_torrent_file.
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  uVar15 = (peVar26->m_files).m_piece_length;
                  uVar23 = 0x4000;
                  if ((int)uVar15 < 0x4000) {
                    uVar23 = uVar15;
                  }
                  if ((int)uVar15 < 1) {
                    uVar23 = 0x4000;
                  }
                  peer_log(this,info,"INVALID_REQUEST",
                           "peer is not interested  t: %d n: %d block_limit: %d",uVar22,
                           (ulong)(uint)(peVar26->m_files).m_num_pieces,(ulong)uVar23);
                  peer_log(this,info,"INTERESTED","artificial incoming INTERESTED message");
                }
                paVar18 = torrent::alerts(this_01);
                if (((paVar18->m_alert_mask)._M_i.m_val & 2) != 0) {
                  local_70._16_8_ = torrent::alerts(this_01);
                  torrent::get_handle((torrent *)local_70);
                  peer_interested =
                       torrent::has_piece_passed(this_01,(piece_index_t)(r->piece).m_val);
                  local_71 = false;
                  local_72 = false;
                  alert_manager::
                  emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool,bool>
                            ((alert_manager *)local_70._16_8_,(torrent_handle *)local_70,
                             &this->m_remote,&this->m_peer_id,r,&peer_interested,&local_71,&local_72
                            );
                  if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       )local_70._8_8_ !=
                      (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       )0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var1 = (_Atomic_word *)(local_70._8_8_ + 0xc);
                      iVar14 = *p_Var1;
                      *p_Var1 = *p_Var1 + -1;
                      UNLOCK();
                    }
                    else {
                      iVar14 = *(_Atomic_word *)(local_70._8_8_ + 0xc);
                      *(int *)(local_70._8_8_ + 0xc) = iVar14 + -1;
                    }
                    if (iVar14 == 1) {
                      (*(*(_func_int ***)local_70._8_8_)[3])();
                    }
                  }
                }
                incoming_interested(this);
              }
              local_70._16_4_ = uVar20;
              index.m_val = (r->piece).m_val;
              if (((((-1 < index.m_val) &&
                    (index.m_val <
                     (((this_01->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces)) &&
                   ((bVar27 = torrent::has_piece_passed(this_01,index), bVar27 ||
                    ((bVar27 = torrent::is_predictive_piece(this_01,(piece_index_t)(r->piece).m_val)
                     , bVar27 || ((this_01->field_0x5cc & 4) != 0)))))) &&
                  (iVar14 = r->start, -1 < iVar14)) &&
                 ((iVar16 = file_storage::piece_size
                                      ((file_storage *)local_70._40_8_,
                                       (piece_index_t)(r->piece).m_val), iVar14 < iVar16 &&
                  (0 < r->length)))) {
                local_70._32_4_ = r->length;
                iVar14 = r->start;
                iVar16 = file_storage::piece_size
                                   ((file_storage *)local_70._40_8_,(piece_index_t)(r->piece).m_val)
                ;
                if (iVar14 + local_70._32_4_ <= iVar16) {
                  iVar14 = (((this_01->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_files).m_piece_length;
                  iVar16 = 0x4000;
                  if (iVar14 < 0x4000) {
                    iVar16 = iVar14;
                  }
                  if (iVar14 < 1) {
                    iVar16 = 0x4000;
                  }
                  if (r->length <= iVar16) {
                    if (((local_70._16_4_ == -1) ||
                        (((this->super_peer_connection_hot_members).field_0x28 & 0x20) == 0)) ||
                       ((int)(uint)(this->m_accept_fast_piece_cnt).
                                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(int)local_70._16_4_] <
                        ((((file_storage *)local_70._40_8_)->m_piece_length + iVar16 + -1) / iVar16)
                        * 3)) goto LAB_002481df;
                    local_70._0_16_ =
                         (undefined1  [16])errors::make_error_code(too_many_requests_when_choked);
                    p_Var21 = (_List_node_base *)plVar3;
                    goto LAB_002481af;
                  }
                }
              }
              counters::inc_stats_counter(this->m_counters,0x11,1);
              iVar14 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])();
              uVar12 = local_70._16_8_;
              if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar14) + 0x68) < 0) {
                local_70._17_3_ = 0;
                local_70[0x10] = this->field_0x887;
                local_70._20_4_ = SUB84(uVar12,4);
                uVar15 = 0xffffffff;
                if (local_70[0x18] != '\0') {
                  uVar15 = file_storage::piece_size
                                     (&((this_01->super_torrent_hot_members).m_torrent_file.
                                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
                }
                local_70._24_8_ = ZEXT48((uint)((file_storage *)local_70._40_8_)->m_num_pieces);
                bVar27 = torrent::has_piece_passed(this_01,(piece_index_t)(r->piece).m_val);
                uVar23 = (((this_01->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_files).m_piece_length;
                uVar24 = 0x4000;
                if ((int)uVar23 < 0x4000) {
                  uVar24 = uVar23;
                }
                if ((int)uVar23 < 1) {
                  uVar24 = 0x4000;
                }
                peer_log(this,info,"INVALID_REQUEST","i: %d t: %d n: %d h: %d block_limit: %d",
                         (ulong)((uint)local_70._16_4_ >> 1 & 1),(ulong)uVar15,local_70._24_8_,
                         (ulong)bVar27,(ulong)uVar24);
              }
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
              if (this->m_num_invalid_requests != 0xffff) {
                this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
              }
              paVar18 = torrent::alerts(this_01);
              if (((paVar18->m_alert_mask)._M_i.m_val & 2) != 0) {
                peer_interested = (bool)((byte)this->field_0x887 >> 1 & 1);
                paVar18 = torrent::alerts(this_01);
                torrent::get_handle((torrent *)local_70);
                local_71 = torrent::has_piece_passed(this_01,(piece_index_t)(r->piece).m_val);
                local_72 = false;
                alert_manager::
                emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                          (paVar18,(torrent_handle *)local_70,&this->m_remote,&this->m_peer_id,r,
                           &local_71,&peer_interested,&local_72);
                if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     )local_70._8_8_ !=
                    (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     )0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var1 = (_Atomic_word *)(local_70._8_8_ + 0xc);
                    iVar14 = *p_Var1;
                    *p_Var1 = *p_Var1 + -1;
                    UNLOCK();
                  }
                  else {
                    iVar14 = *(_Atomic_word *)(local_70._8_8_ + 0xc);
                    *(int *)(local_70._8_8_ + 0xc) = iVar14 + -1;
                  }
                  if (iVar14 == 1) {
                    (*(*(_func_int ***)local_70._8_8_)[3])();
                  }
                }
              }
              if ((((this->field_0x887 & 2) == 0) &&
                  (uVar11 = this->m_num_invalid_requests * -0x3333,
                  (ushort)(uVar11 >> 1 | (ushort)((uVar11 & 1) != 0) << 0xf) < 0x199a)) &&
                 (((this->super_peer_connection_hot_members).field_0x28 & 0x20) != 0)) {
                if ((this->m_num_invalid_requests < 0x12d) || (*(short *)&this->field_0x885 < 0))
                goto LAB_002480ef;
                local_70._0_16_ =
                     (undefined1  [16])errors::make_error_code(too_many_requests_when_choked);
                p_Var21 = (_List_node_base *)plVar3;
                goto LAB_002480cd;
              }
              break;
            }
            counters::inc_stats_counter(this->m_counters,0x10,1);
            peer_log(this,info,"INVALID_REQUEST","incoming request queue full %d",
                     (ulong)(uint)((int)((ulong)((long)(this->m_requests).
                                                                                                              
                                                  super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                                                  .
                                                  super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_requests).
                                                                                                            
                                                  super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                                                  .
                                                  super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                  -0x55555555));
          }
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
          break;
        }
        cVar13 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x90))(p_Var21[1]._M_next,r);
      } while (cVar13 == '\0');
    }
  }
  else {
    counters::inc_stats_counter(this->m_counters,0x11,1);
    if (this->m_num_invalid_requests != 0xffff) {
      this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
    }
    iVar14 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar14) + 0x68) < 0) {
      bVar6 = this->field_0x887;
      uVar22 = 0xffffffff;
      if ((char)peVar26 != '\0') {
        uVar15 = file_storage::piece_size
                           (&((this_01->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
        uVar22 = (ulong)uVar15;
      }
      local_70._24_8_ =
           ZEXT48((uint)(((this_01->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files).m_num_pieces);
      uVar25 = 0;
      if ((char)peVar26 != '\0') {
        bVar27 = torrent::has_piece_passed(this_01,(piece_index_t)(r->piece).m_val);
        uVar25 = (ulong)bVar27;
      }
      peer_log(this,info,"INVALID_REQUEST",
               "piece not super-seeded i: %d t: %d n: %d h: %d ss1: %d ss2: %d",
               (ulong)(bVar6 >> 1 & 1),uVar22,local_70._24_8_,uVar25,
               (ulong)(uint)(this->m_superseed_piece)._M_elems[0].m_val,
               (ulong)(uint)(this->m_superseed_piece)._M_elems[1].m_val);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
    paVar18 = torrent::alerts(this_01);
    if (((paVar18->m_alert_mask)._M_i.m_val & 2) != 0) {
      peer_interested = (bool)((byte)this->field_0x887 >> 1 & 1);
      paVar18 = torrent::alerts(this_01);
      torrent::get_handle((torrent *)local_70);
      local_71 = torrent::has_piece_passed(this_01,(piece_index_t)(r->piece).m_val);
      local_72 = true;
      alert_manager::
      emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                (paVar18,(torrent_handle *)local_70,&this->m_remote,&this->m_peer_id,r,&local_71,
                 &peer_interested,&local_72);
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_70._8_8_ !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_70._8_8_ + 0xc);
          iVar14 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar14 = *(_Atomic_word *)(local_70._8_8_ + 0xc);
          *(int *)(local_70._8_8_ + 0xc) = iVar14 + -1;
        }
        if (iVar14 == 1) {
          (*(*(_func_int ***)local_70._8_8_)[3])();
        }
      }
    }
  }
  goto LAB_00248146;
  while (cVar13 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))(p_Var21[1]._M_next,local_70),
        cVar13 != '\0') {
LAB_002481af:
    p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                 *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var21 == (_List_node_base *)plVar3) goto LAB_0024832f;
  }
  if (p_Var21 == (_List_node_base *)plVar3) {
LAB_0024832f:
    local_70._0_16_ = (undefined1  [16])errors::make_error_code(too_many_requests_when_choked);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_70,1,2);
  }
  else {
LAB_002481df:
    if ((local_70._16_4_ == -1) &&
       (((this->super_peer_connection_hot_members).field_0x28 & 0x20) != 0)) {
      peer_log(this,info,"REJECTING REQUEST","peer choked and piece not in allowed fast set");
      counters::inc_stats_counter(this->m_counters,0x12,1);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
      tVar19 = time_now();
      if ((long)(this->m_last_choke).m_time_diff.__r * 1000000 + (this->m_connect).__d.__r <
          (long)tVar19.__d.__r + -2000000000) {
        local_70._0_16_ = (undefined1  [16])errors::make_error_code(too_many_requests_when_choked);
        p_Var21 = (_List_node_base *)plVar3;
        do {
          p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                       *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var21 == (_List_node_base *)plVar3) goto LAB_0024829e;
          cVar13 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))(p_Var21[1]._M_next,local_70);
        } while (cVar13 != '\0');
        if (p_Var21 == (_List_node_base *)plVar3) {
LAB_0024829e:
          local_70._0_16_ = (undefined1  [16])errors::make_error_code(too_many_requests_when_choked)
          ;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_70,1,2);
        }
      }
    }
    else {
      if (local_70._16_4_ != -1) {
        puVar5 = (this->m_accept_fast_piece_cnt).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)local_70._16_4_;
        *puVar5 = *puVar5 + 1;
      }
      if ((this->m_requests).
          super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->m_requests).
          super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        counters::inc_stats_counter(this->m_counters,0xed,1);
      }
      __position._M_current =
           (this->m_requests).
           super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
           super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_requests).
          super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<libtorrent::peer_request,std::allocator<libtorrent::peer_request>>::
        _M_realloc_insert<libtorrent::peer_request_const&>
                  ((vector<libtorrent::peer_request,std::allocator<libtorrent::peer_request>> *)
                   &this->m_requests,__position,r);
      }
      else {
        (__position._M_current)->length = r->length;
        iVar14 = r->start;
        (__position._M_current)->piece = (piece_index_t)(r->piece).m_val;
        (__position._M_current)->start = iVar14;
        pppVar4 = &(this->m_requests).
                   super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                   .
                   super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar4 = *pppVar4 + 1;
      }
      paVar18 = torrent::alerts(this_01);
      if (((paVar18->m_alert_mask)._M_i.m_val >> 0x10 & 1) != 0) {
        paVar18 = torrent::alerts(this_01);
        torrent::get_handle((torrent *)&peer_interested);
        alert_manager::
        emplace_alert<libtorrent::incoming_request_alert,libtorrent::peer_request_const&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&>
                  (paVar18,r,(torrent_handle *)&peer_interested,&this->m_remote,&this->m_peer_id);
        if (local_38._M_head_impl != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    .
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar14 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar14 = *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     .
                                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            .
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar14 + -1;
          }
          if (iVar14 == 1) {
            (*(code *)(((peer_connection *)
                       ((local_38._M_head_impl)->m_piece_map).
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       .
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_peer_connection_hot_members
                      ).m_torrent.
                      super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
        }
      }
      lVar9 = (this->m_connect).__d.__r;
      tVar19 = time_now();
      auVar10 = SEXT816((long)tVar19.__d.__r - lVar9) * SEXT816(0x431bde82d7b634db);
      (this->m_last_incoming_request).m_time_diff.__r =
           (int)(auVar10._8_8_ >> 0x12) - (auVar10._12_4_ >> 0x1f);
      fill_send_buffer(this);
    }
  }
  goto LAB_00248146;
  while (cVar13 = (**(code **)(*(long *)p_Var21[1]._M_next + 0x128))(p_Var21[1]._M_next,local_70),
        cVar13 != '\0') {
LAB_002480cd:
    p_Var21 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                 *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var21 == (_List_node_base *)plVar3) goto LAB_0024811a;
  }
  if (p_Var21 == (_List_node_base *)plVar3) {
LAB_0024811a:
    local_70._0_16_ = (undefined1  [16])errors::make_error_code(too_many_requests_when_choked);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_70,1,2);
  }
  else {
LAB_002480ef:
    peer_log(this,outgoing_message,"CHOKE","");
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1f])(this);
  }
LAB_00248146:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void peer_connection::incoming_request(peer_request const& r)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
		torrent_info const& ti = t->torrent_file();

		m_counters.inc_stats_counter(counters::piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
		const bool valid_piece_index
			= r.piece >= piece_index_t(0)
			&& r.piece < t->torrent_file().end_piece();

		peer_log(peer_log_alert::incoming_message, "REQUEST"
			, "piece: %d s: %x l: %x", static_cast<int>(r.piece), r.start, r.length);
#endif

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& !super_seeded_piece(r.piece))
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "piece not super-seeded "
					"i: %d t: %d n: %d h: %d ss1: %d ss2: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, valid_piece_index ? t->has_piece_passed(r.piece) : 0
					, static_cast<int>(m_superseed_piece[0])
					, static_cast<int>(m_superseed_piece[1]));
			}
#endif

			write_reject_request(r);

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, true);
			}
			return;
		}
#endif // TORRENT_DISABLE_SUPERSEEDING

		// if we haven't received a bitfield, it was
		// probably omitted, which is the same as 'have_none'
		if (!m_bitfield_received) incoming_have_none();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_request(r)) return;
		}
		if (is_disconnecting()) return;
#endif

		if (!t->valid_metadata())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			// if we don't have valid metadata yet,
			// we shouldn't get a request
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "we don't have metadata yet");
#endif
			write_reject_request(r);
			return;
		}

		if (int(m_requests.size()) > m_settings.get_int(settings_pack::max_allowed_in_request_queue))
		{
			m_counters.inc_stats_counter(counters::max_piece_requests);
			// don't allow clients to abuse our
			// memory consumption.
			// ignore requests if the client
			// is making too many of them.
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "incoming request queue full %d"
				, int(m_requests.size()));
#endif
			write_reject_request(r);
			return;
		}

		int fast_idx = -1;
		auto const fast_iter = std::find(m_accept_fast.begin()
			, m_accept_fast.end(), r.piece);
		if (fast_iter != m_accept_fast.end()) fast_idx = int(fast_iter - m_accept_fast.begin());

		if (!m_peer_interested)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "peer is not interested "
					" t: %d n: %d block_limit: %d"
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, t->block_size());
				peer_log(peer_log_alert::info, "INTERESTED", "artificial incoming INTERESTED message");
			}
#endif
			if (t->alerts().should_post<invalid_request_alert>())
			{
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece)
					, false, false);
			}

			// be lenient and pretend that the peer said it was interested
			incoming_interested();
		}

		// make sure this request
		// is legal and that the peer
		// is not choked
		if (r.piece < piece_index_t(0)
			|| r.piece >= t->torrent_file().end_piece()
			|| (!t->has_piece_passed(r.piece)
#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
				&& !t->is_predictive_piece(r.piece)
#endif
				&& !t->seed_mode())
			|| r.start < 0
			|| r.start >= ti.piece_size(r.piece)
			|| r.length <= 0
			|| r.length + r.start > ti.piece_size(r.piece)
			|| r.length > t->block_size())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST"
					, "i: %d t: %d n: %d h: %d block_limit: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, ti.num_pieces()
					, t->has_piece_passed(r.piece)
					, t->block_size());
			}
#endif

			write_reject_request(r);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, false);
			}

			// every ten invalid request, remind the peer that it's choked
			if (!m_peer_interested && m_num_invalid_requests % 10 == 0 && m_choked)
			{
				// TODO: 2 this should probably be based on time instead of number
				// of request messages. For a very high throughput connection, 300
				// may be a legitimate number of requests to have in flight when
				// getting choked
				if (m_num_invalid_requests > 300 && !m_peer_choked
					&& can_disconnect(errors::too_many_requests_when_choked))
				{
					disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
					return;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::outgoing_message, "CHOKE");
#endif
				write_choke();
			}

			return;
		}

		// if we have choked the client
		// ignore the request
		int const blocks_per_piece =
			(ti.piece_length() + t->block_size() - 1) / t->block_size();

		// disconnect peers that downloads more than foo times an allowed
		// fast piece
		if (m_choked && fast_idx != -1 && m_accept_fast_piece_cnt[fast_idx] >= 3 * blocks_per_piece
			&& can_disconnect(errors::too_many_requests_when_choked))
		{
			disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_choked && fast_idx == -1)
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "REJECTING REQUEST", "peer choked and piece not in allowed fast set");
#endif
			m_counters.inc_stats_counter(counters::choked_piece_requests);
			write_reject_request(r);

			// allow peers to send request up to 2 seconds after getting choked,
			// then disconnect them
			if (aux::time_now() - seconds(2) > m_last_choke.get(m_connect)
				&& can_disconnect(errors::too_many_requests_when_choked))
			{
				disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
				return;
			}
		}
		else
		{
			// increase the allowed fast set counter
			if (fast_idx != -1)
				++m_accept_fast_piece_cnt[fast_idx];

			if (m_requests.empty())
				m_counters.inc_stats_counter(counters::num_peers_up_requests);

			TORRENT_ASSERT(t->valid_metadata());
			TORRENT_ASSERT(r.piece >= piece_index_t(0));
			TORRENT_ASSERT(r.piece < t->torrent_file().end_piece());
			TORRENT_ASSERT(r.length <= default_block_size);
			TORRENT_ASSERT(r.length > 0);

			m_requests.push_back(r);

			if (t->alerts().should_post<incoming_request_alert>())
			{
				t->alerts().emplace_alert<incoming_request_alert>(r, t->get_handle()
					, m_remote, m_peer_id);
			}

			m_last_incoming_request.set(m_connect, aux::time_now());
			fill_send_buffer();
		}
	}